

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Ses_ManFindNetworkExact(Ses_Man_t *pSes,int nGates)

{
  lit *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  sat_solver *psVar5;
  int *piVar6;
  Vec_Int_t *p;
  int iVar7;
  uint uVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  size_t __size;
  int iVar16;
  int iVar17;
  int iVar18;
  Vec_Int_t *pVVar19;
  uint uVar20;
  long lVar21;
  Vec_Int_t *pVVar22;
  uint uVar23;
  timespec ts;
  timespec local_80;
  Vec_Int_t *local_70;
  ulong local_68;
  Vec_Int_t *local_60;
  uint local_54;
  ulong local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec)),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
            CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * -1000000;
  }
  pSes->vPolar->nSize = 0;
  pSes->vAssump->nSize = 0;
  if (pSes->fSatVerbose != 0) {
    printf("create variables for network with %d functions over %d variables and %d/%d gates\n",
           (ulong)(uint)pSes->nSpecFunc,(ulong)(uint)pSes->nSpecVars,(ulong)(uint)nGates,
           (ulong)(uint)pSes->nMaxGates);
  }
  pSes->nGates = nGates;
  pSes->nSimVars = pSes->nRows * nGates;
  iVar3 = pSes->nSpecFunc * nGates;
  pSes->nOutputVars = iVar3;
  pSes->nGateVars = nGates * 3;
  pSes->nSelectVars = 0;
  if (0 < nGates) {
    iVar7 = pSes->nSpecVars;
    iVar16 = iVar7 + nGates;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + ((iVar7 + -1) * iVar7) / 2;
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar16);
    pSes->nSelectVars = iVar11;
  }
  if (pSes->nMaxDepth < 1) {
    iVar7 = 0;
  }
  else {
    iVar7 = ((nGates + 1) * nGates) / 2 + pSes->nArrTimeMax * nGates;
  }
  pSes->nDepthVars = iVar7;
  pSes->nDepthOffset = 0;
  pSes->nSelectOffset = iVar7;
  iVar7 = iVar7 + pSes->nSelectVars;
  pSes->nGateOffset = iVar7;
  iVar7 = iVar7 + nGates * 3;
  pSes->nOutputOffset = iVar7;
  pSes->nSimOffset = iVar7 + iVar3;
  if (pSes->pSat == (sat_solver *)0x0) {
    psVar5 = sat_solver_new();
    pSes->pSat = psVar5;
  }
  else {
    sat_solver_restart(pSes->pSat);
  }
  sat_solver_setnvars(pSes->pSat,
                      pSes->nOutputVars + pSes->nSimVars + pSes->nGateVars + pSes->nSelectVars +
                      pSes->nDepthVars);
  if (pSes->nMaxDepth != -1) {
    uVar15 = 0;
    if (0 < pSes->nGates) {
      iVar3 = 2;
      uVar23 = 0;
      local_38 = lVar9;
      do {
        local_48 = CONCAT44(local_48._4_4_,iVar3);
        local_50 = uVar15 >> 1;
        iVar3 = (int)local_50 + 1;
        local_40 = uVar15;
        if (1 < uVar23) {
          pVVar19 = (Vec_Int_t *)0x1;
          do {
            iVar7 = 2;
            uVar15 = 0;
            iVar11 = 0;
            local_60 = pVVar19;
            do {
              if (pSes->nGates <= (int)uVar23) goto LAB_002c04a4;
              local_68 = CONCAT44(local_68._4_4_,iVar7);
              iVar7 = pSes->nSpecVars;
              uVar8 = iVar7 + iVar11;
              iVar4 = iVar7 + (int)local_60;
              iVar17 = iVar7 + uVar23;
              iVar16 = pSes->nSelectOffset;
              do {
                iVar16 = iVar16 + ((iVar7 + -1) * iVar7) / 2;
                iVar7 = iVar7 + 1;
              } while (iVar7 < iVar17);
              uVar12 = ~uVar8;
              iVar16 = iVar4 + uVar12 + (int)((uVar12 + iVar17 * 2) * uVar8) / 2 + iVar16;
              if (iVar16 < 0) goto LAB_002c0485;
              local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,(int)uVar15);
              local_80.tv_sec._0_4_ = iVar16 * 2 + 1;
              iVar7 = pSes->nArrTimeMax;
              if (-1 < iVar7 + iVar11) {
                iVar16 = 0;
                do {
                  if (pSes->nGates <= iVar11) goto LAB_002bf065;
                  iVar4 = iVar11 * iVar7 + pSes->nDepthOffset + (int)(uVar15 >> 1) + iVar16;
                  if (iVar4 < 0) goto LAB_002c0485;
                  local_80.tv_sec._4_4_ = iVar4 * 2 + 1;
                  if (pSes->nGates <= (int)uVar23) goto LAB_002bf065;
                  if ((int)(iVar7 + uVar23) <= iVar16) goto LAB_002bf8a2;
                  iVar7 = pSes->nDepthOffset + iVar7 * uVar23 + iVar16 + iVar3;
                  if (iVar7 < 0) goto LAB_002c0485;
                  local_80.tv_nsec._0_4_ = iVar7 * 2;
                  sat_solver_addclause
                            (pSes->pSat,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4));
                  iVar7 = pSes->nArrTimeMax;
                  bVar2 = iVar16 < iVar7 + iVar11;
                  iVar16 = iVar16 + 1;
                } while (bVar2);
              }
              iVar11 = iVar11 + 1;
              uVar15 = (ulong)((uint)local_70 + (uint)local_68);
              iVar7 = (uint)local_68 + 2;
            } while (iVar11 != (int)local_60);
            uVar8 = (int)local_60 + 1;
            pVVar19 = (Vec_Int_t *)(ulong)uVar8;
          } while (uVar8 != uVar23);
        }
        if (uVar23 != 0) {
          iVar7 = 2;
          local_54 = 0;
          uVar8 = 0;
          do {
            local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,iVar7);
            iVar7 = pSes->nSpecVars;
            iVar11 = iVar7 + uVar8;
            if (iVar11 != 0 && SCARRY4(iVar7,uVar8) == iVar11 < 0) {
              uVar20 = local_54 >> 1;
              local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,-uVar8);
              uVar12 = 0;
              do {
                if (pSes->nGates <= (int)uVar23) goto LAB_002c04a4;
                iVar4 = iVar7 + uVar23;
                iVar16 = pSes->nSelectOffset;
                do {
                  iVar16 = iVar16 + ((iVar7 + -1) * iVar7) / 2;
                  iVar7 = iVar7 + 1;
                } while (iVar7 < iVar4);
                iVar16 = iVar11 + ~uVar12 + (int)((~uVar12 + iVar4 * 2) * uVar12) / 2 + iVar16;
                if (iVar16 < 0) goto LAB_002c0485;
                local_68 = CONCAT44(local_68._4_4_,uVar12);
                local_80.tv_sec._0_4_ = iVar16 * 2 + 1;
                iVar7 = pSes->nArrTimeMax;
                if ((int)(uint)local_70 <= iVar7) {
                  iVar11 = 0;
                  do {
                    if (pSes->nGates <= (int)uVar8) goto LAB_002bf065;
                    iVar16 = uVar8 * iVar7 + pSes->nDepthOffset + uVar20 + iVar11;
                    if (iVar16 < 0) goto LAB_002c0485;
                    local_80.tv_sec._4_4_ = iVar16 * 2 + 1;
                    if (pSes->nGates <= (int)uVar23) goto LAB_002bf065;
                    if ((int)(iVar7 + uVar23) <= iVar11) goto LAB_002bf8a2;
                    iVar7 = pSes->nDepthOffset + iVar7 * uVar23 + iVar3 + iVar11;
                    if (iVar7 < 0) goto LAB_002c0485;
                    local_80.tv_nsec._0_4_ = iVar7 * 2;
                    sat_solver_addclause
                              (pSes->pSat,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4));
                    iVar7 = pSes->nArrTimeMax;
                    bVar2 = iVar11 < (int)(iVar7 + uVar8);
                    iVar11 = iVar11 + 1;
                  } while (bVar2);
                }
                uVar12 = (uint)local_68 + 1;
                iVar7 = pSes->nSpecVars;
                iVar11 = iVar7 + uVar8;
              } while ((int)uVar12 < iVar11);
            }
            uVar8 = uVar8 + 1;
            local_54 = local_54 + (int)local_60;
            iVar7 = (int)local_60 + 2;
          } while (uVar8 != uVar23);
        }
        if (pSes->pArrTimeProfile == (int *)0x0) {
          if (pSes->nGates <= (int)uVar23) {
LAB_002bf065:
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3f4,"int Ses_ManDepthVar(Ses_Man_t *, int, int)");
          }
          if ((int)(pSes->nArrTimeMax + uVar23) < 0) {
LAB_002bf8a2:
            __assert_fail("j <= pSes->nArrTimeMax + i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3f5,"int Ses_ManDepthVar(Ses_Man_t *, int, int)");
          }
          iVar3 = ((uVar23 + 1) * uVar23 >> 1) + pSes->nArrTimeMax * uVar23 + pSes->nDepthOffset;
          if (iVar3 < 0) goto LAB_002c0485;
          Vec_IntPush(pSes->vAssump,iVar3 * 2);
        }
        else if (1 < (int)(pSes->nSpecVars + uVar23)) {
          lVar9 = 1;
          do {
            iVar3 = pSes->nSpecVars;
            if (0 < iVar3) {
              lVar21 = 0;
              do {
                iVar7 = pSes->pArrTimeProfile[lVar21];
                if ((lVar9 < iVar3) && (iVar11 = pSes->pArrTimeProfile[lVar9], iVar7 < iVar11)) {
                  iVar7 = iVar11;
                }
                if (pSes->nGates <= (int)uVar23) goto LAB_002c04a4;
                iVar11 = iVar3 + uVar23;
                if (iVar11 <= lVar9) goto LAB_002c04c3;
                iVar16 = pSes->nSelectOffset;
                if (uVar23 != 0) {
                  do {
                    iVar16 = iVar16 + ((iVar3 + -1) * iVar3) / 2;
                    iVar3 = iVar3 + 1;
                  } while (iVar3 < iVar11);
                }
                uVar8 = ~(uint)lVar21;
                iVar4 = (int)lVar9;
                iVar16 = uVar8 + iVar4 + (int)((uVar8 + iVar11 * 2) * (uint)lVar21) / 2 + iVar16;
                if (iVar16 < 0) goto LAB_002c0485;
                local_80.tv_sec._0_4_ = iVar16 * 2 + 1;
                if ((int)(pSes->nArrTimeMax + uVar23) < iVar7) goto LAB_002bf8a2;
                iVar3 = iVar7 + ((uVar23 + 1) * uVar23 >> 1) + pSes->nArrTimeMax * uVar23 +
                        pSes->nDepthOffset;
                if (iVar3 < 0) goto LAB_002c0485;
                local_80.tv_sec._4_4_ = iVar3 * 2;
                sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                lVar21 = lVar21 + 1;
                iVar3 = pSes->nSpecVars;
                iVar7 = iVar3;
                if (iVar4 < iVar3) {
                  iVar7 = iVar4;
                }
              } while (lVar21 < iVar7);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < (long)(int)uVar23 + (long)pSes->nSpecVars);
        }
        uVar15 = local_50;
        iVar7 = pSes->nArrTimeMax;
        iVar3 = iVar7 + uVar23;
        if (iVar3 != 0 && SCARRY4(iVar7,uVar23) == iVar3 < 0) {
          iVar11 = 0;
          do {
            if (pSes->nGates <= (int)uVar23) goto LAB_002bf065;
            iVar7 = iVar7 * uVar23 + pSes->nDepthOffset;
            iVar16 = (int)uVar15 + iVar11;
            iVar4 = iVar16 + iVar7 + 1;
            if (iVar4 < 0) goto LAB_002c0485;
            local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
            if (iVar3 < iVar11) goto LAB_002bf8a2;
            iVar16 = iVar16 + iVar7;
            if (iVar16 < 0) goto LAB_002c0485;
            local_80.tv_sec._4_4_ = iVar16 * 2;
            sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
            iVar7 = pSes->nArrTimeMax;
            iVar3 = iVar7 + uVar23;
            iVar11 = iVar11 + 1;
          } while (iVar11 < iVar3);
        }
        if ((pSes->nMaxDepth < iVar3) && (0 < pSes->nSpecFunc)) {
          iVar3 = 0;
          do {
            if (pSes->nGates <= (int)uVar23) goto LAB_002c050f;
            iVar7 = pSes->nGates * iVar3 + uVar23 + pSes->nOutputOffset;
            if (iVar7 < 0) goto LAB_002c0485;
            local_80.tv_sec._0_4_ = iVar7 * 2 + 1;
            if ((int)(pSes->nArrTimeMax + uVar23) < pSes->nMaxDepth) goto LAB_002bf8a2;
            iVar7 = pSes->nMaxDepth + ((uVar23 + 1) * uVar23 >> 1) + pSes->nArrTimeMax * uVar23 +
                    pSes->nDepthOffset;
            if (iVar7 < 0) goto LAB_002c0485;
            local_80.tv_sec._4_4_ = iVar7 * 2 + 1;
            iVar7 = sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
            if (iVar7 == 0) {
              uVar15 = 1;
              lVar9 = local_38;
              goto LAB_002bed9d;
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < pSes->nSpecFunc);
        }
        uVar23 = uVar23 + 1;
        uVar15 = (ulong)(uint)((int)local_40 + (int)local_48);
        iVar3 = (int)local_48 + 2;
      } while ((int)uVar23 < pSes->nGates);
      uVar15 = 0;
      lVar9 = local_38;
    }
LAB_002bed9d:
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec) / 1000 +
               CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * 1000000;
    }
    pSes->timeInstance = pSes->timeInstance + lVar21 + lVar9;
    if ((char)uVar15 != '\0') {
      return 2;
    }
  }
  psVar5 = pSes->pSat;
  piVar6 = pSes->vPolar->pArray;
  uVar23 = pSes->vPolar->nSize;
  if (0 < psVar5->size) {
    lVar9 = 0;
    do {
      psVar5->polarity[lVar9] = '\0';
      lVar9 = lVar9 + 1;
    } while (lVar9 < psVar5->size);
  }
  if (0 < (int)uVar23) {
    uVar15 = 0;
    do {
      psVar5->polarity[piVar6[uVar15]] = '\x01';
      uVar15 = uVar15 + 1;
    } while (uVar23 != uVar15);
  }
  iVar3 = Ses_ManSolve(pSes);
  if (iVar3 == 0) {
    return 2;
  }
  if (iVar3 != 2) {
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      local_48 = 1;
    }
    else {
      lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                     SEXT816(CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec)),8);
      local_48 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
                 CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * -1000000;
    }
    if (0 < pSes->nRows) {
      uVar15 = 0;
      do {
        if (((pSes->pTtValues[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0) &&
           (iVar3 = Ses_ManCreateTruthTableClause(pSes,(int)uVar15), iVar3 == 0)) {
          bVar2 = true;
          goto LAB_002bf020;
        }
        uVar23 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar23;
      } while ((int)uVar23 < pSes->nRows);
    }
    iVar3 = pSes->nSpecFunc;
    if (iVar3 == 1) {
      iVar3 = pSes->nGates;
      if (iVar3 < 2) {
        iVar7 = iVar3 + -1;
      }
      else {
        iVar11 = 0;
        do {
          if (pSes->nSpecFunc < 1) goto LAB_002c052e;
          if (iVar3 <= iVar11) {
LAB_002c050f:
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3d3,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
          }
          iVar3 = pSes->nOutputOffset + iVar11;
          if (iVar3 < 0) goto LAB_002c0485;
          Vec_IntPush(pSes->vAssump,iVar3 * 2 + 1);
          iVar11 = iVar11 + 1;
          iVar3 = pSes->nGates;
          iVar7 = iVar3 + -1;
        } while (iVar11 < iVar7);
      }
      if (pSes->nSpecFunc < 1) {
LAB_002c052e:
        __assert_fail("h < pSes->nSpecFunc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x3d2,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
      }
      iVar7 = iVar7 + pSes->nOutputOffset;
      if (iVar7 < 0) {
LAB_002c0485:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(pSes->vAssump,iVar7 * 2);
      pVVar19 = (Vec_Int_t *)malloc(0x10);
      pVVar19->nCap = 0;
      pVVar19->nSize = 0;
      pVVar19->pArray = (int *)0x0;
    }
    else {
      pVVar19 = (Vec_Int_t *)malloc(0x10);
      pVVar19->nCap = 0;
      pVVar19->nSize = 0;
      pVVar19->pArray = (int *)0x0;
      if (0 < iVar3) {
        iVar3 = 0;
        do {
          iVar7 = pSes->nGates;
          pVVar19->nSize = iVar7;
          if (pVVar19->nCap < iVar7) {
            if (pVVar19->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((long)iVar7 << 2);
            }
            else {
              piVar6 = (int *)realloc(pVVar19->pArray,(long)iVar7 << 2);
            }
            pVVar19->pArray = piVar6;
            if (piVar6 == (int *)0x0) goto LAB_002c056c;
            pVVar19->nCap = iVar7;
          }
          iVar7 = pSes->nGates;
          if (0 < iVar7) {
            iVar11 = 0;
            do {
              if (pSes->nSpecFunc <= iVar3) goto LAB_002c052e;
              iVar7 = iVar7 * iVar3 + pSes->nOutputOffset + iVar11;
              if (iVar7 < 0) goto LAB_002c0485;
              Vec_IntSetEntry(pVVar19,iVar11,iVar7 * 2);
              iVar11 = iVar11 + 1;
              iVar7 = pSes->nGates;
            } while (iVar11 < iVar7);
          }
          sat_solver_addclause(pSes->pSat,pVVar19->pArray,pVVar19->pArray + iVar7);
          iVar3 = iVar3 + 1;
        } while (iVar3 < pSes->nSpecFunc);
      }
    }
    local_70 = pVVar19;
    if (0 < pSes->nGates) {
      iVar3 = 0;
      do {
        iVar7 = ((pSes->nSpecVars + iVar3 + -1) * (pSes->nSpecVars + iVar3)) / 2;
        pVVar19->nSize = iVar7;
        if (pVVar19->nCap < iVar7) {
          if (pVVar19->pArray == (int *)0x0) {
            piVar6 = (int *)malloc((long)iVar7 << 2);
          }
          else {
            piVar6 = (int *)realloc(pVVar19->pArray,(long)iVar7 << 2);
          }
          pVVar19->pArray = piVar6;
          if (piVar6 == (int *)0x0) goto LAB_002c056c;
          pVVar19->nCap = iVar7;
        }
        iVar7 = pSes->nSpecVars + iVar3;
        if (iVar7 == 0 || SCARRY4(pSes->nSpecVars,iVar3) != iVar7 < 0) {
          lVar9 = 0;
        }
        else {
          iVar7 = 0;
          uVar23 = 0;
          do {
            iVar4 = uVar23 + 1;
            iVar11 = pSes->nSpecVars;
            iVar16 = iVar11 + iVar3;
            local_68 = CONCAT44(local_68._4_4_,iVar4);
            if (iVar4 < iVar16) {
              iVar17 = iVar7;
              do {
                if (pSes->nGates <= iVar3) goto LAB_002c04a4;
                iVar18 = pSes->nSelectOffset;
                if (iVar3 != 0) {
                  do {
                    iVar18 = iVar18 + ((iVar11 + -1) * iVar11) / 2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < iVar16);
                }
                iVar18 = (int)((~uVar23 + iVar16 * 2) * uVar23) / 2 + iVar4 + ~uVar23 + iVar18;
                if (iVar18 < 0) goto LAB_002c0485;
                iVar7 = iVar17 + 1;
                Vec_IntSetEntry(local_70,iVar17,iVar18 * 2);
                iVar4 = iVar4 + 1;
                iVar11 = pSes->nSpecVars;
                iVar16 = iVar11 + iVar3;
                iVar17 = iVar7;
              } while (iVar4 < iVar16);
            }
            uVar23 = (uint)local_68;
          } while ((int)(uint)local_68 < pSes->nSpecVars + iVar3);
          lVar9 = (long)iVar7;
          pVVar19 = local_70;
        }
        sat_solver_addclause(pSes->pSat,pVVar19->pArray,pVVar19->pArray + lVar9);
        iVar3 = iVar3 + 1;
      } while (iVar3 < pSes->nGates);
    }
    if ((pSes->fMakeAIG != 0) && (0 < pSes->nGates)) {
      iVar3 = 0;
      plVar1 = (lit *)((long)&local_80.tv_nsec + 4);
      iVar7 = 0;
      do {
        iVar11 = pSes->nGateOffset + iVar3;
        if (iVar11 < 0) goto LAB_002c0485;
        local_80.tv_sec._0_4_ = iVar11 * 2 + 1;
        if (iVar11 + 1 < 0) goto LAB_002c0485;
        local_80.tv_sec._4_4_ = (iVar11 + 1) * 2 + 1;
        if (iVar11 + 2 < 0) goto LAB_002c0485;
        local_80.tv_nsec._0_4_ = (iVar11 + 2) * 2;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        if (pSes->nGates <= iVar7) goto LAB_002c054d;
        iVar11 = pSes->nGateOffset + iVar3;
        if (iVar11 < 0) goto LAB_002c0485;
        local_80.tv_sec._0_4_ = iVar11 * 2 + 1;
        if (iVar11 + 1 < 0) goto LAB_002c0485;
        local_80.tv_sec._4_4_ = (iVar11 + 1) * 2;
        if (iVar11 + 2 < 0) goto LAB_002c0485;
        local_80.tv_nsec._0_4_ = (iVar11 + 2) * 2 + 1;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        if (pSes->nGates <= iVar7) goto LAB_002c054d;
        iVar11 = pSes->nGateOffset + iVar3;
        if (iVar11 < 0) goto LAB_002c0485;
        local_80.tv_sec._0_4_ = iVar11 * 2;
        if (iVar11 + 1 < 0) goto LAB_002c0485;
        local_80.tv_sec._4_4_ = (iVar11 + 1) * 2 + 1;
        if (iVar11 + 2 < 0) goto LAB_002c0485;
        local_80.tv_nsec._0_4_ = (iVar11 + 2) * 2 + 1;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        iVar7 = iVar7 + 1;
        iVar3 = iVar3 + 3;
      } while (iVar7 < pSes->nGates);
    }
    if (0 < pSes->nGates) {
      iVar3 = 0;
      plVar1 = (lit *)((long)&local_80.tv_nsec + 4);
      iVar7 = 0;
      do {
        iVar11 = pSes->nGateOffset + iVar3;
        if (iVar11 < 0) goto LAB_002c0485;
        local_80.tv_sec._0_4_ = iVar11 * 2;
        if (iVar11 + 1 < 0) goto LAB_002c0485;
        local_80.tv_sec._4_4_ = (iVar11 + 1) * 2;
        if (iVar11 + 2 < 0) goto LAB_002c0485;
        local_80.tv_nsec._0_4_ = (iVar11 + 2) * 2;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        if (pSes->nGates <= iVar7) goto LAB_002c054d;
        iVar11 = pSes->nGateOffset + iVar3;
        if (iVar11 < 0) goto LAB_002c0485;
        local_80.tv_sec._0_4_ = iVar11 * 2 + 1;
        if (iVar11 + 1 < 0) goto LAB_002c0485;
        local_80.tv_sec._4_4_ = (iVar11 + 1) * 2;
        if (iVar11 + 2 < 0) goto LAB_002c0485;
        local_80.tv_nsec._0_4_ = (iVar11 + 2) * 2 + 1;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        if (pSes->nGates <= iVar7) goto LAB_002c054d;
        iVar11 = pSes->nGateOffset + iVar3;
        if (iVar11 < 0) goto LAB_002c0485;
        local_80.tv_sec._0_4_ = iVar11 * 2;
        if (iVar11 + 1 < 0) goto LAB_002c0485;
        local_80.tv_sec._4_4_ = (iVar11 + 1) * 2 + 1;
        if (iVar11 + 2 < 0) goto LAB_002c0485;
        local_80.tv_nsec._0_4_ = (iVar11 + 2) * 2 + 1;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        iVar7 = iVar7 + 1;
        iVar3 = iVar3 + 3;
      } while (iVar7 < pSes->nGates);
    }
    if (0 < pSes->nGates) {
      iVar3 = 0;
      do {
        if (1 < pSes->nSpecVars + iVar3) {
          local_68 = CONCAT44(local_68._4_4_,1);
          local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,1 - iVar3);
          do {
            uVar23 = 0;
            do {
              if (pSes->nGates <= iVar3) goto LAB_002c04a4;
              iVar11 = pSes->nSpecVars;
              iVar7 = iVar11 + iVar3;
              if (iVar7 <= (int)(uint)local_68) goto LAB_002c04c3;
              iVar16 = pSes->nSelectOffset;
              iVar4 = iVar11;
              if (iVar3 != 0) {
                do {
                  iVar16 = iVar16 + ((iVar4 + -1) * iVar4) / 2;
                  iVar4 = iVar4 + 1;
                } while (iVar4 < iVar7);
              }
              iVar16 = ~uVar23 + (uint)local_68 + (int)((~uVar23 + iVar7 * 2) * uVar23) / 2 + iVar16
              ;
              if (iVar16 < 0) goto LAB_002c0485;
              local_80.tv_sec._0_4_ = iVar16 * 2 + 1;
              if ((int)local_60 < iVar11) {
                uVar8 = 1;
                do {
                  uVar20 = 0;
                  uVar12 = (uint)local_68;
                  do {
                    if (uVar23 != uVar20 || uVar12 != uVar8) {
                      if (pSes->nGates <= iVar3) goto LAB_002c04a4;
                      iVar11 = pSes->nSpecVars;
                      iVar7 = iVar11 + iVar3;
                      if (iVar7 <= (int)uVar8) goto LAB_002c04c3;
                      iVar16 = pSes->nSelectOffset;
                      if (iVar3 != 0) {
                        do {
                          iVar16 = iVar16 + ((iVar11 + -1) * iVar11) / 2;
                          iVar11 = iVar11 + 1;
                        } while (iVar11 < iVar7);
                      }
                      iVar16 = ~uVar20 + uVar8 + (int)((~uVar20 + iVar7 * 2) * uVar20) / 2 + iVar16;
                      if (iVar16 < 0) goto LAB_002c0485;
                      local_80.tv_sec._4_4_ = iVar16 * 2 + 1;
                      if ((int)local_80.tv_sec <= iVar16 * 2) {
                        sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                      }
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != uVar8);
                  uVar8 = uVar8 + 1;
                } while ((int)uVar8 < pSes->nSpecVars + iVar3);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != (uint)local_68);
            iVar7 = (uint)local_68 + 1;
            local_68 = CONCAT44(local_68._4_4_,iVar7);
          } while (iVar7 < pSes->nSpecVars + iVar3);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < pSes->nGates);
    }
    pVVar22 = local_70;
    pVVar19 = pSes->vStairDecVars;
    if (0 < pVVar19->nSize) {
      lVar9 = 0;
      uVar23 = 0;
      do {
        uVar8 = pVVar19->pArray[lVar9];
        iVar3 = pSes->nGates;
        uVar12 = (uint)lVar9;
        if ((int)uVar8 <= (int)(uVar23 + iVar3 + -2)) {
          uVar20 = ~uVar12;
          iVar7 = iVar3 + uVar20;
          if (iVar3 <= iVar7) {
LAB_002c04a4:
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,999,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
          }
          iVar11 = pSes->nSpecVars;
          iVar16 = iVar11 + uVar23 + iVar3 + -2;
          iVar3 = iVar11 + iVar7;
          if (iVar3 <= iVar16) {
LAB_002c04c3:
            __assert_fail("k < pSes->nSpecVars + i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,1000,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
          }
          if (iVar16 <= (int)uVar8) {
LAB_002c04f0:
            __assert_fail("j < k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3e9,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
          }
          iVar4 = pSes->nSelectOffset;
          if (0 < iVar7) {
            do {
              iVar4 = iVar4 + ((iVar11 + -1) * iVar11) / 2;
              iVar11 = iVar11 + 1;
            } while (iVar11 < iVar3);
          }
          iVar4 = iVar16 + ~uVar8 + (int)((~uVar8 + iVar3 * 2) * uVar8) / 2 + iVar4;
          if (iVar4 < 0) goto LAB_002c0485;
          Vec_IntPush(pSes->vAssump,iVar4 * 2);
          switch(pSes->pStairDecFunc[lVar9]) {
          case 1:
            iVar3 = uVar20 + pSes->nGates;
            if (iVar3 < pSes->nGates) {
              iVar3 = iVar3 * 3 + pSes->nGateOffset;
              if (-1 < iVar3) goto LAB_002bf7cd;
              goto LAB_002c0485;
            }
            goto LAB_002c054d;
          case 2:
            iVar3 = pSes->nGates + uVar20;
            if (pSes->nGates <= iVar3) goto LAB_002c054d;
            iVar3 = iVar3 * 3 + pSes->nGateOffset + 1;
            if (iVar3 < 0) goto LAB_002c0485;
            pVVar19 = pSes->vAssump;
            iVar3 = iVar3 * 2 + 1;
            break;
          case 3:
            iVar3 = pSes->nGates + uVar20;
            if (iVar3 < pSes->nGates) {
              iVar3 = iVar3 * 3 + pSes->nGateOffset + 1;
              if (-1 < iVar3) {
                Vec_IntPush(pSes->vAssump,iVar3 * 2);
                iVar3 = uVar20 + pSes->nGates;
                if (iVar3 < pSes->nGates) {
                  iVar3 = iVar3 * 3 + pSes->nGateOffset + 2;
                  if (-1 < iVar3) {
                    pVVar19 = pSes->vAssump;
                    iVar3 = iVar3 * 2;
                    goto LAB_002bf83d;
                  }
                  goto LAB_002c0485;
                }
                goto LAB_002c054d;
              }
              goto LAB_002c0485;
            }
            goto LAB_002c054d;
          case 4:
            goto switchD_002bf6ea_caseD_4;
          case 5:
            iVar3 = pSes->nGates + uVar20;
            if (pSes->nGates <= iVar3) {
LAB_002c054d:
              __assert_fail("i < pSes->nGates",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,0x3da,"int Ses_ManGateVar(Ses_Man_t *, int, int, int)");
            }
            iVar3 = iVar3 * 3 + pSes->nGateOffset;
            if (iVar3 < 0) goto LAB_002c0485;
            Vec_IntPush(pSes->vAssump,iVar3 * 2);
            iVar3 = pSes->nGates + uVar20;
            if (pSes->nGates <= iVar3) goto LAB_002c054d;
            iVar3 = iVar3 * 3 + pSes->nGateOffset + 1;
            if (iVar3 < 0) goto LAB_002c0485;
            pVVar19 = pSes->vAssump;
            iVar3 = iVar3 * 2;
            break;
          default:
            printf("func: %d\n");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x569,"int Ses_ManCreateClauses(Ses_Man_t *)");
          }
          Vec_IntPush(pVVar19,iVar3);
          iVar3 = uVar20 + pSes->nGates;
          if (pSes->nGates <= iVar3) goto LAB_002c054d;
          iVar3 = iVar3 * 3 + pSes->nGateOffset + 2;
          if (iVar3 < 0) goto LAB_002c0485;
LAB_002bf7cd:
          pVVar19 = pSes->vAssump;
          iVar3 = iVar3 * 2 + 1;
LAB_002bf83d:
          Vec_IntPush(pVVar19,iVar3);
        }
switchD_002bf6ea_caseD_4:
        lVar9 = lVar9 + 1;
        uVar23 = ~uVar12;
        pVVar19 = pSes->vStairDecVars;
      } while (lVar9 < pVVar19->nSize);
    }
    lVar9 = (long)((pSes->nSpecVars + pSes->nGates + -2) * pSes->nGates) + (long)pSes->nSpecFunc;
    iVar3 = (int)lVar9;
    pVVar22->nSize = iVar3;
    if (pVVar22->nCap < iVar3) {
      __size = lVar9 * 4;
      if (pVVar22->pArray == (int *)0x0) {
        piVar6 = (int *)malloc(__size);
      }
      else {
        piVar6 = (int *)realloc(pVVar22->pArray,__size);
      }
      pVVar22->pArray = piVar6;
      if (piVar6 == (int *)0x0) {
LAB_002c056c:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x22c,"void Vec_IntGrowResize(Vec_Int_t *, int)");
      }
      pVVar22->nCap = iVar3;
    }
    if (0 < pSes->nGates) {
      uVar23 = 0;
      do {
        iVar3 = 0;
        if (0 < pSes->nSpecFunc) {
          iVar7 = 0;
          do {
            if (pSes->nGates <= (int)uVar23) goto LAB_002c050f;
            iVar11 = pSes->nGates * iVar7 + uVar23 + pSes->nOutputOffset;
            if (iVar11 < 0) goto LAB_002c0485;
            iVar3 = iVar7 + 1;
            Vec_IntSetEntry(pVVar22,iVar7,iVar11 * 2);
            iVar7 = iVar3;
          } while (iVar3 < pSes->nSpecFunc);
        }
        uVar8 = uVar23 + 1;
        local_68 = CONCAT44(local_68._4_4_,uVar8);
        if ((int)uVar8 < pSes->nGates) {
          do {
            iVar7 = pSes->nSpecVars;
            iVar11 = iVar7 + uVar23;
            if (iVar11 != 0 && SCARRY4(iVar7,uVar23) == iVar11 < 0) {
              uVar12 = 0;
              iVar16 = iVar3;
              do {
                if (pSes->nGates <= (int)uVar8) goto LAB_002c04a4;
                if (uVar8 <= uVar23) goto LAB_002c04c3;
                iVar3 = iVar16 + 1;
                iVar17 = iVar7 + uVar8;
                iVar4 = pSes->nSelectOffset;
                do {
                  iVar4 = iVar4 + ((iVar7 + -1) * iVar7) / 2;
                  iVar7 = iVar7 + 1;
                } while (iVar7 < iVar17);
                iVar4 = iVar11 + ~uVar12 + (int)((~uVar12 + iVar17 * 2) * uVar12) / 2 + iVar4;
                if (iVar4 < 0) goto LAB_002c0485;
                Vec_IntSetEntry(local_70,iVar16,iVar4 * 2);
                uVar12 = uVar12 + 1;
                iVar7 = pSes->nSpecVars;
                iVar11 = iVar7 + uVar23;
                iVar16 = iVar3;
              } while ((int)uVar12 < iVar11);
            }
            iVar7 = pSes->nSpecVars;
            while( true ) {
              iVar16 = iVar7 + uVar8;
              if (iVar16 <= iVar11 + 1) break;
              if (pSes->nGates <= (int)uVar8) goto LAB_002c04a4;
              uVar12 = iVar7 + uVar23;
              if (iVar11 < (int)uVar12) goto LAB_002c04f0;
              iVar4 = pSes->nSelectOffset;
              do {
                iVar4 = iVar4 + ((iVar7 + -1) * iVar7) / 2;
                iVar7 = iVar7 + 1;
              } while (iVar7 < iVar16);
              iVar4 = (iVar11 - uVar12) + (int)((~uVar12 + iVar16 * 2) * uVar12) / 2 + iVar4;
              if (iVar4 < 0) goto LAB_002c0485;
              Vec_IntSetEntry(local_70,iVar3,iVar4 * 2);
              iVar7 = pSes->nSpecVars;
              iVar11 = iVar11 + 1;
              iVar3 = iVar3 + 1;
            }
            uVar8 = uVar8 + 1;
          } while ((int)uVar8 < pSes->nGates);
        }
        pVVar22 = local_70;
        sat_solver_addclause(pSes->pSat,local_70->pArray,local_70->pArray + iVar3);
        uVar23 = (uint)local_68;
      } while ((int)(uint)local_68 < pSes->nGates);
    }
    if (pVVar22->pArray != (int *)0x0) {
      free(pVVar22->pArray);
      pVVar22->pArray = (int *)0x0;
    }
    free(pVVar22);
    if (1 < pSes->nGates) {
      uVar23 = 0;
      do {
        uVar8 = uVar23 + 1;
        local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,uVar8);
        if ((int)uVar8 < pSes->nGates) {
          local_68 = CONCAT44(local_68._4_4_,1 - uVar23);
          do {
            if ((int)(uint)local_68 < pSes->nSpecVars) {
              uVar12 = 1;
              do {
                uVar20 = 0;
                do {
                  if (pSes->nGates <= (int)uVar23) goto LAB_002c04a4;
                  iVar3 = pSes->nSpecVars;
                  iVar7 = iVar3 + uVar23;
                  if (iVar7 <= (int)uVar12) goto LAB_002c04c3;
                  iVar11 = pSes->nSelectOffset;
                  iVar16 = iVar11;
                  iVar4 = iVar3;
                  if (uVar23 != 0) {
                    do {
                      iVar16 = iVar16 + ((iVar4 + -1) * iVar4) / 2;
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < iVar7);
                  }
                  uVar13 = ~uVar20;
                  iVar16 = (int)((uVar13 + iVar7 * 2) * uVar20) / 2 + uVar12 + uVar13 + iVar16;
                  if (iVar16 < 0) goto LAB_002c0485;
                  local_80.tv_sec._0_4_ = iVar16 * 2 + 1;
                  if (pSes->nGates <= (int)uVar8) goto LAB_002c04a4;
                  if (uVar8 <= uVar23) goto LAB_002c04c3;
                  if (iVar7 <= (int)uVar20) goto LAB_002c04f0;
                  iVar16 = iVar3 + uVar8;
                  do {
                    iVar11 = iVar11 + ((iVar3 + -1) * iVar3) / 2;
                    iVar3 = iVar3 + 1;
                  } while (iVar3 < iVar16);
                  iVar11 = iVar7 + uVar13 + (int)((uVar13 + iVar16 * 2) * uVar20) / 2 + iVar11;
                  if (iVar11 < 0) goto LAB_002c0485;
                  local_80.tv_sec._4_4_ = iVar11 * 2 + 1;
                  sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                  if (pSes->nGates <= (int)uVar8) goto LAB_002c04a4;
                  iVar3 = pSes->nSpecVars;
                  iVar7 = iVar3 + uVar23;
                  if (iVar7 <= (int)uVar12) goto LAB_002c04f0;
                  iVar16 = iVar3 + uVar8;
                  iVar11 = pSes->nSelectOffset;
                  do {
                    iVar11 = iVar11 + ((iVar3 + -1) * iVar3) / 2;
                    iVar3 = iVar3 + 1;
                  } while (iVar3 < iVar16);
                  iVar11 = iVar7 + ~uVar12 + (int)((~uVar12 + iVar16 * 2) * uVar12) / 2 + iVar11;
                  if (iVar11 < 0) goto LAB_002c0485;
                  local_80.tv_sec._4_4_ = iVar11 * 2 + 1;
                  sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar12);
                uVar12 = uVar12 + 1;
              } while ((int)uVar12 < (int)(pSes->nSpecVars + uVar23));
            }
            uVar8 = uVar8 + 1;
          } while ((int)uVar8 < pSes->nGates);
        }
        uVar23 = (uint)local_70;
      } while ((int)(uint)local_70 < pSes->nGates + -1);
    }
    if (2 < pSes->nGates) {
      uVar23 = 0;
      do {
        uVar8 = uVar23 + 1;
        local_50 = CONCAT44(local_50._4_4_,uVar8);
        if ((int)uVar8 < pSes->nGates + -1) {
          local_54 = 1 - uVar23;
          local_70 = (Vec_Int_t *)(ulong)~uVar23;
          do {
            iVar3 = uVar8 + 1;
            local_40 = CONCAT44(local_40._4_4_,iVar3);
            if (iVar3 < pSes->nGates) {
              local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,(int)local_70 + uVar8);
              do {
                if ((int)local_54 < pSes->nSpecVars) {
                  uVar15 = 1;
                  do {
                    uVar12 = 0;
                    local_68 = uVar15;
                    do {
                      iVar7 = pSes->nGates;
                      if (iVar7 <= (int)uVar23) goto LAB_002c04a4;
                      iVar11 = pSes->nSpecVars;
                      iVar16 = iVar11 + uVar23;
                      iVar4 = (int)local_68;
                      if (iVar16 <= iVar4) goto LAB_002c04c3;
                      iVar17 = pSes->nSelectOffset;
                      iVar18 = iVar17;
                      iVar14 = iVar11;
                      if (uVar23 != 0) {
                        do {
                          iVar18 = iVar18 + ((iVar14 + -1) * iVar14) / 2;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < iVar16);
                      }
                      uVar20 = ~uVar12;
                      iVar18 = (int)((uVar20 + iVar16 * 2) * uVar12) / 2 + iVar4 + uVar20 + iVar18;
                      if (iVar18 < 0) goto LAB_002c0485;
                      local_80.tv_sec._0_4_ = iVar18 * 2 + 1;
                      if (iVar7 <= (int)uVar8) goto LAB_002c04a4;
                      iVar14 = iVar11 + uVar8;
                      iVar16 = iVar17;
                      iVar18 = iVar11;
                      if (iVar14 <= iVar4) goto LAB_002c04c3;
                      do {
                        iVar16 = iVar16 + ((iVar18 + -1) * iVar18) / 2;
                        iVar18 = iVar18 + 1;
                      } while (iVar18 < iVar14);
                      iVar16 = (int)((uVar20 + iVar14 * 2) * uVar12) / 2 + iVar4 + uVar20 + iVar16;
                      if (iVar16 < 0) goto LAB_002c0485;
                      local_80.tv_sec._4_4_ = iVar16 * 2 + 1;
                      if (iVar7 <= iVar3) goto LAB_002c04a4;
                      iVar7 = iVar11 + iVar3;
                      if (iVar7 <= (int)uVar8) goto LAB_002c04c3;
                      if (uVar8 <= uVar23) goto LAB_002c04f0;
                      do {
                        iVar17 = iVar17 + ((iVar11 + -1) * iVar11) / 2;
                        iVar11 = iVar11 + 1;
                      } while (iVar11 < iVar7);
                      iVar17 = (int)(((int)local_70 + iVar7 * 2) * uVar23) / 2 + (int)local_60 +
                               iVar17;
                      if (iVar17 < 0) goto LAB_002c0485;
                      local_80.tv_nsec._0_4_ = iVar17 * 2 + 1;
                      sat_solver_addclause
                                (pSes->pSat,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4));
                      uVar12 = uVar12 + 1;
                    } while (uVar12 != (uint)local_68);
                    uVar12 = (uint)local_68 + 1;
                    uVar15 = (ulong)uVar12;
                  } while ((int)uVar12 < (int)(pSes->nSpecVars + uVar23));
                }
                iVar3 = iVar3 + 1;
              } while (iVar3 < pSes->nGates);
            }
            uVar8 = (uint)local_40;
          } while ((int)(uint)local_40 < pSes->nGates + -1);
        }
        uVar23 = (uint)local_50;
      } while ((int)(uint)local_50 < pSes->nGates + -2);
    }
    if (1 < pSes->nGates) {
      iVar3 = 0;
      do {
        if (2 < pSes->nSpecVars + iVar3) {
          iVar7 = iVar3 + 1;
          uVar15 = 2;
          do {
            uVar23 = 1;
            local_68 = uVar15;
            do {
              local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,(int)local_68 + ~uVar23);
              uVar8 = 0;
              do {
                if (pSes->nGates <= iVar3) goto LAB_002c04a4;
                iVar11 = pSes->nSpecVars;
                iVar16 = iVar11 + iVar3;
                uVar12 = (uint)local_68;
                if (iVar16 <= (int)uVar12) goto LAB_002c04c3;
                iVar4 = pSes->nSelectOffset;
                iVar17 = iVar4;
                iVar18 = iVar11;
                if (iVar3 != 0) {
                  do {
                    iVar17 = iVar17 + ((iVar18 + -1) * iVar18) / 2;
                    iVar18 = iVar18 + 1;
                  } while (iVar18 < iVar16);
                }
                iVar17 = (int)((~uVar23 + iVar16 * 2) * uVar23) / 2 + (uint)local_70 + iVar17;
                if (iVar17 < 0) goto LAB_002c0485;
                local_80.tv_sec._0_4_ = iVar17 * 2 + 1;
                if (pSes->nGates <= iVar7) goto LAB_002c04a4;
                iVar16 = iVar11 + iVar7;
                if (iVar16 <= (int)uVar12) goto LAB_002c04c3;
                if (uVar8 == uVar12) goto LAB_002c04f0;
                do {
                  iVar4 = iVar4 + ((iVar11 + -1) * iVar11) / 2;
                  iVar11 = iVar11 + 1;
                } while (iVar11 < iVar16);
                iVar4 = ~uVar8 + uVar12 + (int)((~uVar8 + iVar16 * 2) * uVar8) / 2 + iVar4;
                if (iVar4 < 0) goto LAB_002c0485;
                local_80.tv_sec._4_4_ = iVar4 * 2 + 1;
                sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar23);
              uVar23 = uVar23 + 1;
            } while (uVar23 != (uint)local_68);
            uVar23 = 0;
            do {
              local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,uVar23);
              local_60 = (Vec_Int_t *)(ulong)~uVar23;
              iVar11 = (int)local_68;
              uVar8 = 1;
              do {
                uVar12 = 0;
                do {
                  if (pSes->nGates <= iVar3) goto LAB_002c04a4;
                  iVar16 = pSes->nSpecVars;
                  iVar4 = iVar16 + iVar3;
                  if (iVar4 <= (int)local_68) goto LAB_002c04c3;
                  iVar17 = pSes->nSelectOffset;
                  iVar18 = iVar17;
                  iVar14 = iVar16;
                  if (iVar3 != 0) {
                    do {
                      iVar18 = iVar18 + ((iVar14 + -1) * iVar14) / 2;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < iVar4);
                  }
                  iVar18 = (int)(((int)local_60 + iVar4 * 2) * (uint)local_70) / 2 +
                           iVar11 + ~uVar23 + iVar18;
                  if (iVar18 < 0) goto LAB_002c0485;
                  local_80.tv_sec._0_4_ = iVar18 * 2 + 1;
                  if (pSes->nGates <= iVar7) goto LAB_002c04a4;
                  iVar4 = iVar16 + iVar7;
                  if (iVar4 <= (int)uVar8) goto LAB_002c04c3;
                  do {
                    iVar17 = iVar17 + ((iVar16 + -1) * iVar16) / 2;
                    iVar16 = iVar16 + 1;
                  } while (iVar16 < iVar4);
                  iVar17 = ~uVar12 + uVar8 + (int)((~uVar12 + iVar4 * 2) * uVar12) / 2 + iVar17;
                  if (iVar17 < 0) goto LAB_002c0485;
                  local_80.tv_sec._4_4_ = iVar17 * 2 + 1;
                  sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar8);
                uVar8 = uVar8 + 1;
                uVar12 = (uint)local_68;
              } while (uVar8 != uVar12);
              uVar23 = (uint)local_70 + 1;
            } while (uVar23 != uVar12);
            uVar15 = (ulong)(uVar12 + 1);
          } while ((int)(uVar12 + 1) < pSes->nSpecVars + iVar3);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < pSes->nGates + -1);
    }
    if ((pSes->nSpecFunc == 1) && (1 < pSes->nSpecVars)) {
      pVVar19 = (Vec_Int_t *)0x1;
      do {
        pVVar22 = (Vec_Int_t *)0x0;
        local_60 = pVVar19;
        do {
          iVar3 = Extra_TruthVarsSymm((uint *)pSes->pSpec,pSes->nSpecVars,(int)pVVar22,(int)pVVar19)
          ;
          if ((iVar3 != 0) &&
             ((piVar6 = pSes->pArrTimeProfile, piVar6 == (int *)0x0 ||
              (piVar6[(long)pVVar22] <= piVar6[(long)pVVar19])))) {
            if (pSes->fSatVerbose != 0) {
              printf("variables %d and %d are symmetric\n",(ulong)pVVar22 & 0xffffffff,
                     (ulong)pVVar19 & 0xffffffff);
            }
            if (0 < pSes->nGates) {
              uVar15 = 0;
              do {
                pVVar10 = (Vec_Int_t *)0x0;
                local_68 = uVar15;
                do {
                  if (pVVar22 != pVVar10) {
                    p = (Vec_Int_t *)malloc(0x10);
                    p->nCap = 0;
                    p->nSize = 0;
                    p->pArray = (int *)0x0;
                    iVar3 = (int)uVar15;
                    if (pSes->nGates <= iVar3) goto LAB_002c04a4;
                    iVar7 = pSes->nSpecVars;
                    iVar11 = iVar7 + iVar3;
                    if ((long)iVar11 <= (long)pVVar19) goto LAB_002c04c3;
                    iVar16 = pSes->nSelectOffset;
                    if (iVar3 != 0) {
                      do {
                        iVar16 = iVar16 + ((iVar7 + -1) * iVar7) / 2;
                        iVar7 = iVar7 + 1;
                      } while (iVar7 < iVar11);
                    }
                    uVar23 = ~(uint)pVVar10;
                    iVar16 = uVar23 + (int)pVVar19 +
                             (int)((uVar23 + iVar11 * 2) * (uint)pVVar10) / 2 + iVar16;
                    local_70 = pVVar10;
                    if (iVar16 < 0) goto LAB_002c0485;
                    Vec_IntPush(p,iVar16 * 2 + 1);
                    if (iVar3 != 0) {
                      iVar3 = 0;
                      do {
                        if (1 < pSes->nSpecVars + iVar3) {
                          pVVar19 = (Vec_Int_t *)0x1;
                          do {
                            pVVar10 = (Vec_Int_t *)0x0;
                            do {
                              if (pVVar22 == pVVar19 || pVVar22 == pVVar10) {
                                if (pSes->nGates <= iVar3) goto LAB_002c04a4;
                                iVar11 = pSes->nSpecVars;
                                iVar7 = iVar11 + iVar3;
                                if ((long)iVar7 <= (long)pVVar19) goto LAB_002c04c3;
                                iVar16 = pSes->nSelectOffset;
                                if (iVar3 != 0) {
                                  do {
                                    iVar16 = iVar16 + ((iVar11 + -1) * iVar11) / 2;
                                    iVar11 = iVar11 + 1;
                                  } while (iVar11 < iVar7);
                                }
                                uVar23 = ~(uint)pVVar10;
                                iVar16 = uVar23 + (int)pVVar19 +
                                         (int)((uVar23 + iVar7 * 2) * (uint)pVVar10) / 2 + iVar16;
                                if (iVar16 < 0) goto LAB_002c0485;
                                Vec_IntPush(p,iVar16 * 2);
                              }
                              pVVar10 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
                            } while (pVVar10 != pVVar19);
                            pVVar19 = (Vec_Int_t *)((long)&pVVar19->nCap + 1);
                          } while ((long)pVVar19 < (long)iVar3 + (long)pSes->nSpecVars);
                        }
                        iVar3 = iVar3 + 1;
                        uVar15 = local_68;
                      } while (iVar3 != (int)local_68);
                    }
                    plVar1 = p->pArray;
                    sat_solver_addclause(pSes->pSat,plVar1,plVar1 + p->nSize);
                    if (plVar1 != (lit *)0x0) {
                      free(plVar1);
                      p->pArray = (int *)0x0;
                    }
                    free(p);
                    pVVar10 = local_70;
                    pVVar19 = local_60;
                  }
                  pVVar10 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
                } while (pVVar19 != pVVar10);
                uVar23 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar23;
              } while ((int)uVar23 < pSes->nGates);
            }
          }
          pVVar22 = (Vec_Int_t *)((long)&pVVar22->nCap + 1);
        } while (pVVar22 != pVVar19);
        pVVar19 = (Vec_Int_t *)((long)&pVVar19->nCap + 1);
        bVar2 = false;
      } while ((long)pVVar19 < (long)pSes->nSpecVars);
    }
    else {
      bVar2 = false;
    }
LAB_002bf020:
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec) / 1000 +
              CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * 1000000;
    }
    pSes->timeInstance = pSes->timeInstance + lVar9 + local_48;
    if (bVar2) {
      return 2;
    }
    iVar3 = Ses_ManSolve(pSes);
    if (iVar3 == 1) {
      return 1;
    }
    if (iVar3 != 2) {
      return 2;
    }
  }
  pSes->fHitResLimit = 1;
  return 0;
}

Assistant:

static int Ses_ManFindNetworkExact( Ses_Man_t * pSes, int nGates )
{
    int f, fSat;
    abctime timeStart;

    /* solve */
    timeStart = Abc_Clock();
    Vec_IntClear( pSes->vPolar );
    Vec_IntClear( pSes->vAssump );
    Ses_ManCreateVars( pSes, nGates );

    if ( pSes->nMaxDepth != -1 )
    {
        f = Ses_ManCreateDepthClauses( pSes );
        pSes->timeInstance += ( Abc_Clock() - timeStart );
        if ( !f ) return 2; /* proven UNSAT while creating clauses */
    }

    sat_solver_set_polarity( pSes->pSat, Vec_IntArray( pSes->vPolar ), Vec_IntSize( pSes->vPolar ) );

    /* first solve */
    fSat = Ses_ManSolve( pSes );
    if ( fSat == 0 )
        return 2; /* UNSAT, continue with next # of gates */
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    timeStart = Abc_Clock();
    f = Ses_ManCreateClauses( pSes );
    pSes->timeInstance += ( Abc_Clock() - timeStart );
    if ( !f ) return 2; /* proven UNSAT while creating clauses */

    fSat = Ses_ManSolve( pSes );
    if ( fSat == 1 )
        return 1;
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    return 2; /* UNSAT continue */
}